

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O3

void __thiscall
eastl::
hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
::DoFreeNodes(hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
              *this,node_type **pNodeArray,size_type n)

{
  hash_node<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
  *phVar1;
  value_type *pvVar2;
  ulong uVar3;
  node_type *pnVar4;
  node_type *pTempNode;
  
  if (n != 0) {
    uVar3 = 0;
    do {
      pnVar4 = pNodeArray[uVar3];
      while (pnVar4 != (node_type *)0x0) {
        phVar1 = pnVar4->mpNext;
        pvVar2 = (pnVar4->mValue).second.mpBegin;
        if ((pvVar2 != (value_type *)0x0) &&
           (1 < (long)(pnVar4->mValue).second.mpCapacity - (long)pvVar2)) {
          operator_delete__(pvVar2);
        }
        pvVar2 = (pnVar4->mValue).first.mpBegin;
        if ((pvVar2 != (value_type *)0x0) &&
           (1 < (long)(pnVar4->mValue).first.mpCapacity - (long)pvVar2)) {
          operator_delete__(pvVar2);
        }
        operator_delete__(pnVar4);
        pnVar4 = phVar1;
      }
      pNodeArray[uVar3] = (node_type *)0x0;
      uVar3 = uVar3 + 1;
    } while (uVar3 != n);
  }
  return;
}

Assistant:

void hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::DoFreeNodes(node_type** pNodeArray, size_type n)
    {
        for(size_type i = 0; i < n; ++i)
        {
            node_type* pNode = pNodeArray[i];
            while(pNode)
            {
                node_type* const pTempNode = pNode;
                pNode = pNode->mpNext;
                DoFreeNode(pTempNode);
            }
            pNodeArray[i] = NULL;
        }
    }